

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O1

bool MeCab::CharProperty::compile(char *cfile,char *ufile,char *ofile)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  CharInfo CVar13;
  char *__s;
  undefined8 *puVar14;
  size_t sVar15;
  long *plVar16;
  char *pcVar17;
  ostream *poVar18;
  iterator iVar19;
  long lVar20;
  undefined8 *puVar21;
  char *pcVar22;
  iterator iVar23;
  _Base_ptr p_Var24;
  void *__s_00;
  char *pcVar25;
  istringstream *piVar26;
  char *pcVar27;
  ulong uVar28;
  char *pcVar29;
  ulong uVar30;
  pointer pRVar31;
  ulong uVar32;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
  *ppVar33;
  pointer pbVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint size;
  vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
  range;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
  category;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unk;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  category_ary;
  string key;
  ifstream ifs2;
  istringstream iss2;
  istringstream iss;
  ifstream ifs;
  undefined4 local_a24;
  size_t local_a20;
  undefined1 local_a18 [16];
  pointer local_a08;
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
  local_9d8;
  undefined1 local_9a8 [32];
  _Base_ptr local_988;
  size_t local_980;
  undefined8 *local_978;
  char *local_970;
  undefined1 local_968 [16];
  pointer local_958;
  char *local_950;
  char *local_948;
  undefined1 local_940 [8];
  size_type local_938;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_930;
  byte abStack_920 [216];
  ios_base local_848 [264];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
  local_740 [13];
  undefined1 local_538 [8];
  undefined1 local_530 [7] [16];
  ios_base local_4c0 [264];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  __s = (char *)operator_new__(0x2000);
  puVar14 = (undefined8 *)operator_new__(0x1000);
  local_a18 = (undefined1  [16])0x0;
  local_a08 = (pointer)0x0;
  local_9d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_9d8._M_impl.super__Rb_tree_header._M_header;
  local_9d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_9d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_9d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_958 = (pointer)0x0;
  local_968 = (undefined1  [16])0x0;
  local_9d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_9d8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::ifstream::ifstream((istringstream *)local_238,cfile,_S_in);
  local_740[0].first._M_dataplus._M_p = (pointer)&local_740[0].first.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_740,"DEFAULT 1 0 0\nSPACE   0 1 0\n0x0020 SPACE\n","");
  std::__cxx11::istringstream::istringstream(local_3b8,(string *)local_740,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740[0].first._M_dataplus._M_p != &local_740[0].first.field_2) {
    operator_delete(local_740[0].first._M_dataplus._M_p);
  }
  piVar26 = (istringstream *)local_238;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    if (cfile == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x17b498);
    }
    else {
      sVar15 = strlen(cfile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,cfile,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," is not found. minimum setting is used",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    piVar26 = local_3b8;
  }
  local_948 = cfile;
  local_970 = ufile;
  local_950 = ofile;
  sVar15 = 0;
  while( true ) {
    std::ios::widen((char)*(undefined8 *)(*(long *)piVar26 + -0x18) + (char)piVar26);
    plVar16 = (long *)std::istream::getline((char *)piVar26,(long)__s,'\0');
    pcVar25 = local_970;
    if ((*(byte *)((long)plVar16 + *(long *)(*plVar16 + -0x18) + 0x20) & 5) != 0) break;
    if ((*__s != '\0') && (*__s != '#')) {
      local_a20 = sVar15;
      sVar15 = strlen(__s);
      pcVar17 = __s + sVar15;
      uVar28 = 0;
      puVar21 = puVar14;
      pcVar25 = __s;
      do {
        pcVar29 = pcVar17;
        pcVar22 = pcVar25;
        if (0x1ff < uVar28) break;
        for (; pcVar27 = pcVar17, pcVar22 != pcVar17; pcVar22 = pcVar22 + 1) {
          if (*pcVar22 != '\t') {
            lVar20 = 0;
            do {
              bVar35 = lVar20 == 1;
              pcVar27 = pcVar29;
              if (bVar35) goto LAB_00130129;
              lVar5 = lVar20 + 1;
              lVar20 = lVar20 + 1;
            } while (*pcVar22 != "\t "[lVar5]);
          }
          bVar35 = false;
          pcVar27 = pcVar22;
LAB_00130129:
          if (!bVar35) break;
          pcVar29 = pcVar27;
        }
        *pcVar27 = '\0';
        if (*pcVar25 != '\0') {
          *puVar21 = pcVar25;
          puVar21 = puVar21 + 1;
          uVar28 = uVar28 + 1;
        }
        pcVar25 = pcVar27 + 1;
      } while (pcVar27 != pcVar17);
      if (uVar28 < 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x99);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"size >= 2",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"format error: ",0xe);
        sVar15 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,__s,sVar15);
        die::~die((die *)local_740);
      }
      pcVar25 = (char *)*puVar14;
      iVar10 = strncmp(pcVar25,"0x",2);
      if (iVar10 == 0) {
        std::__cxx11::string::string((string *)local_740,pcVar25,(allocator *)local_940);
        local_940 = (undefined1  [8])&local_930;
        local_938 = 0;
        local_930._M_local_buf[0] = '\0';
        lVar20 = std::__cxx11::string::find((char *)local_740,0x15c9f9,0);
        if (lVar20 == -1) {
          std::__cxx11::string::_M_assign((string *)local_940);
        }
        else {
          std::__cxx11::string::substr((ulong)local_538,(ulong)local_740);
          std::__cxx11::string::operator=((string *)local_940,(string *)local_538);
          if ((undefined1 *)CONCAT44(local_538._4_4_,local_538._0_4_) != local_530[0] + 8) {
            operator_delete((void *)CONCAT44(local_538._4_4_,local_538._0_4_));
          }
          std::__cxx11::string::substr((ulong)local_538,(ulong)local_740);
          std::__cxx11::string::operator=((string *)local_740,(string *)local_538);
          if ((undefined1 *)CONCAT44(local_538._4_4_,local_538._0_4_) != local_530[0] + 8) {
            operator_delete((void *)CONCAT44(local_538._4_4_,local_538._0_4_));
          }
        }
        local_530[0] = (undefined1  [16])0x0;
        local_530[1]._0_8_ = (pointer)0x0;
        local_538._0_4_ = anon_unknown_3::atohex(local_740[0].first._M_dataplus._M_p);
        local_538._4_4_ = anon_unknown_3::atohex((char *)local_940);
        if ((((int)local_538._4_4_ < (int)local_538._0_4_) || (0xfffe < (uint)local_538._4_4_)) ||
           (0xfffe < (uint)local_538._0_4_)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xae);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,
                     "r.low >= 0 && r.low < 0xffff && r.high >= 0 && r.high < 0xffff && r.low <= r.high"
                     ,0x51);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"range error: low=",0x11);
          poVar18 = (ostream *)std::ostream::operator<<((ostream *)poVar18,local_538._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18," high=",6);
          std::ostream::operator<<((ostream *)poVar18,local_538._4_4_);
          die::~die((die *)local_9a8);
        }
        if (1 < uVar28) {
          uVar32 = 1;
          do {
            if (*(char *)puVar14[uVar32] == '#') break;
            std::__cxx11::string::string
                      ((string *)local_9a8,(char *)puVar14[uVar32],(allocator *)local_9f8);
            iVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                     ::find(&local_9d8,(key_type *)local_9a8);
            if ((_Rb_tree_header *)iVar19._M_node == &local_9d8._M_impl.super__Rb_tree_header) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                         ,0x73);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,"category.find(std::string(col[i])) != category.end()",0x34);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"category [",10);
              pcVar25 = (char *)puVar14[uVar32];
              if (pcVar25 == (char *)0x0) {
                std::ios::clear((int)poVar18 + (int)*(undefined8 *)(*(long *)poVar18 + -0x18));
              }
              else {
                sVar15 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar25,sVar15);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] is undefined",0xe);
              die::~die((die *)&local_a24);
            }
            if ((undefined1 *)local_9a8._0_8_ != local_9a8 + 0x10) {
              operator_delete((void *)local_9a8._0_8_);
            }
            std::__cxx11::string::string
                      ((string *)local_9a8,(char *)puVar14[uVar32],(allocator *)local_9f8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_530,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_9a8);
            if ((undefined1 *)local_9a8._0_8_ != local_9a8 + 0x10) {
              operator_delete((void *)local_9a8._0_8_);
            }
            uVar32 = uVar32 + 1;
          } while (uVar28 != uVar32);
        }
        uVar9 = local_a18._8_8_;
        if ((pointer)local_a18._8_8_ == local_a08) {
          uVar8 = local_a18._0_8_;
          if (local_a18._8_8_ - local_a18._0_8_ == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar32 = (long)(local_a18._8_8_ - local_a18._0_8_) >> 5;
          uVar28 = uVar32;
          if (local_a18._8_8_ == local_a18._0_8_) {
            uVar28 = 1;
          }
          uVar30 = uVar28 + uVar32;
          if (0x3fffffffffffffe < uVar30) {
            uVar30 = 0x3ffffffffffffff;
          }
          if (CARRY8(uVar28,uVar32)) {
            uVar30 = 0x3ffffffffffffff;
          }
          if (uVar30 == 0) {
            puVar21 = (undefined8 *)0x0;
          }
          else {
            puVar21 = (undefined8 *)operator_new(uVar30 << 5);
          }
          puVar21[uVar32 * 4] = CONCAT44(local_538._4_4_,local_538._0_4_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(puVar21 + uVar32 * 4 + 1),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_530);
          local_978 = puVar21;
          for (pRVar31 = (pointer)uVar8; (pointer)uVar9 != pRVar31; pRVar31 = pRVar31 + 1) {
            *puVar21 = *(undefined8 *)pRVar31;
            pbVar34 = (pRVar31->c).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            puVar21[1] = (pRVar31->c).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            puVar21[2] = pbVar34;
            puVar21[3] = (pRVar31->c).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pRVar31->c).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pRVar31->c).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pRVar31->c).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&pRVar31->c);
            puVar21 = puVar21 + 4;
          }
          if ((pointer)uVar8 != (pointer)0x0) {
            operator_delete((void *)uVar8);
          }
          local_a18._8_8_ = puVar21 + 4;
          local_a18._0_8_ = local_978;
          local_a08 = (pointer)(local_978 + uVar30 * 4);
        }
        else {
          *(ulong *)local_a18._8_8_ = CONCAT44(local_538._4_4_,local_538._0_4_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_a18._8_8_ + 8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_530);
          local_a18._8_8_ = (pointer)(uVar9 + 0x20);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_530);
        sVar15 = local_a20;
        if (local_940 != (undefined1  [8])&local_930) {
          operator_delete((void *)local_940);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740[0].first._M_dataplus._M_p != &local_740[0].first.field_2) {
          operator_delete(local_740[0].first._M_dataplus._M_p);
        }
      }
      else {
        if (uVar28 < 4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbb);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"size >= 4",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"format error: ",0xe);
          sVar15 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,__s,sVar15);
          die::~die((die *)local_740);
        }
        std::__cxx11::string::string((string *)local_940,(char *)*puVar14,(allocator *)local_740);
        iVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                 ::find(&local_9d8,(key_type *)local_940);
        if ((_Rb_tree_header *)iVar19._M_node != &local_9d8._M_impl.super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"category.find(key) == category.end()",0x24);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"category ",9);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,(char *)local_940,local_938);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18," is already defined",0x13);
          die::~die((die *)local_740);
        }
        iVar10 = atoi((char *)puVar14[1]);
        uVar11 = atoi((char *)puVar14[2]);
        uVar12 = atoi((char *)puVar14[3]);
        local_740[0].first._M_dataplus._M_p = (pointer)&local_740[0].first.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_740,local_940,(char *)((long)local_940 + local_938));
        sVar15 = local_a20;
        local_740[0].second =
             (CharInfo)
             (((uint)local_a20 & 0xff) << 0x12 |
             (uVar12 & 0xf) << 0x1a | (uVar11 & 1) << 0x1e | iVar10 << 0x1f);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MeCab::CharInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,MeCab::CharInfo>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MeCab::CharInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MeCab::CharInfo>>>
                    *)&local_9d8,local_740);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740[0].first._M_dataplus._M_p != &local_740[0].first.field_2) {
          operator_delete(local_740[0].first._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_968,(value_type *)local_940);
        if (local_940 != (undefined1  [8])&local_930) {
          operator_delete((void *)local_940);
        }
        sVar15 = sVar15 + 1;
      }
    }
  }
  paVar2 = &local_740[0].first.field_2;
  if (0x11 < local_9d8._M_impl.super__Rb_tree_header._M_node_count) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"category.size() < 18",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"too many categories(>= 18)",0x1a);
    die::~die((die *)local_740);
  }
  local_740[0].first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"DEFAULT","");
  iVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
           ::find(&local_9d8,&local_740[0].first);
  if ((_Rb_tree_header *)iVar19._M_node == &local_9d8._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"category.find(\"DEFAULT\") != category.end()",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"category [DEFAULT] is undefined",0x1f);
    die::~die((die *)local_940);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740[0].first._M_dataplus._M_p != paVar2) {
    operator_delete(local_740[0].first._M_dataplus._M_p);
  }
  local_740[0].first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"SPACE","");
  iVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
           ::find(&local_9d8,&local_740[0].first);
  if ((_Rb_tree_header *)iVar19._M_node == &local_9d8._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"category.find(\"SPACE\") != category.end()",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"category [SPACE] is undefined",0x1d)
    ;
    die::~die((die *)local_940);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740[0].first._M_dataplus._M_p != paVar2) {
    operator_delete(local_740[0].first._M_dataplus._M_p);
  }
  local_740[0].first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_740,"DEFAULT,0,0,0,*\nSPACE,0,0,0,*\n","");
  std::__cxx11::istringstream::istringstream((istringstream *)local_538,(string *)local_740,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740[0].first._M_dataplus._M_p != paVar2) {
    operator_delete(local_740[0].first._M_dataplus._M_p);
  }
  std::ifstream::ifstream(local_740,pcVar25,_S_in);
  ppVar33 = local_740;
  if (((&local_740[0].second.field_0x0)[*(long *)(local_740[0].first._M_dataplus._M_p + -0x18)] & 5)
      != 0) {
    if (pcVar25 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x17b498);
    }
    else {
      sVar15 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar25,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," is not found. minimum setting is used.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    ppVar33 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>
               *)local_538;
  }
  local_9a8._8_4_ = _S_red;
  local_9a8._16_8_ = 0;
  local_9a8._24_8_ = (_Base_ptr)(local_9a8 + 8);
  local_988 = (_Base_ptr)(local_9a8 + 8);
  local_980 = 0;
  do {
    std::ios::widen((char)*(undefined8 *)((ppVar33->first)._M_dataplus._M_p + -0x18) + (char)ppVar33
                   );
    plVar16 = (long *)std::istream::getline((char *)ppVar33,(long)__s,'\0');
    pcVar25 = local_970;
    if ((*(byte *)((long)plVar16 + *(long *)(*plVar16 + -0x18) + 0x20) & 5) != 0) {
      if ((_Rb_tree_header *)local_9d8._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_9d8._M_impl.super__Rb_tree_header) {
        p_Var24 = local_9d8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          iVar23 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_9a8,(key_type *)(p_Var24 + 1));
          if (iVar23._M_node == (_Base_ptr)(local_9a8 + 8)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                       ,0x73);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xec);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,"unk.find(it->first) != unk.end()",0x20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"category [",10);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar18,*(char **)(p_Var24 + 1),(long)p_Var24[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] is undefined in ",0x12);
            if (pcVar25 == (char *)0x0) {
              std::ios::clear((int)poVar18 + (int)*(undefined8 *)(*(long *)poVar18 + -0x18));
            }
            else {
              sVar15 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar25,sVar15);
            }
            die::~die((die *)local_940);
          }
          p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
        } while ((_Rb_tree_header *)p_Var24 != &local_9d8._M_impl.super__Rb_tree_header);
      }
      __s_00 = operator_new(0x3fffc);
      memset(__s_00,0,0x3fffc);
      local_9f8 = (undefined1  [16])0x0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_9e8._8_8_;
      local_9e8 = auVar4 << 0x40;
      local_940 = (undefined1  [8])&local_930;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"DEFAULT","");
      pcVar25 = local_950;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_9f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_940);
      if (local_940 != (undefined1  [8])&local_930) {
        operator_delete((void *)local_940);
      }
      CVar13 = anon_unknown_3::encode
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_9f8,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                           *)&local_9d8);
      auVar7 = _DAT_0015b740;
      auVar6 = _DAT_0015a060;
      auVar4 = _DAT_0015a050;
      lVar20 = 0;
      do {
        auVar36._8_4_ = (int)lVar20;
        auVar36._0_8_ = lVar20;
        auVar36._12_4_ = (int)((ulong)lVar20 >> 0x20);
        auVar37 = (auVar36 | auVar4) ^ auVar6;
        if (auVar37._4_4_ == -0x80000000 && auVar37._0_4_ < -0x7fff0001) {
          *(CharInfo *)((long)__s_00 + lVar20 * 4) = CVar13;
          *(CharInfo *)((long)__s_00 + lVar20 * 4 + 4) = CVar13;
        }
        auVar36 = (auVar36 | auVar7) ^ auVar6;
        if (auVar36._4_4_ == -0x80000000 && auVar36._0_4_ < -0x7fff0001) {
          *(CharInfo *)((long)__s_00 + lVar20 * 4 + 8) = CVar13;
          *(CharInfo *)((long)__s_00 + lVar20 * 4 + 0xc) = CVar13;
        }
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0x10000);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_9f8);
      uVar9 = local_a18._8_8_;
      if (local_a18._0_8_ != local_a18._8_8_) {
        pRVar31 = (pointer)local_a18._0_8_;
        do {
          CVar13 = anon_unknown_3::encode
                             (&pRVar31->c,
                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
                               *)&local_9d8);
          if (pRVar31->low <= pRVar31->high) {
            lVar20 = (long)pRVar31->low + -1;
            do {
              *(CharInfo *)((long)__s_00 + lVar20 * 4 + 4) = CVar13;
              lVar20 = lVar20 + 1;
            } while (lVar20 < pRVar31->high);
          }
          pRVar31 = pRVar31 + 1;
        } while (pRVar31 != (pointer)uVar9);
      }
      std::ofstream::ofstream(local_940,pcVar25,_S_out|_S_bin);
      if ((abStack_920[*(long *)((long)local_940 + -0x18)] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x104);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"ofs",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"permission denied: ",0x13);
        if (pcVar25 == (char *)0x0) {
          std::ios::clear((int)poVar18 + (int)*(undefined8 *)(*(long *)poVar18 + -0x18));
        }
        else {
          sVar15 = strlen(pcVar25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar25,sVar15);
        }
        die::~die((die *)local_9f8);
      }
      local_a24 = (undefined4)local_9d8._M_impl.super__Rb_tree_header._M_node_count;
      std::ostream::write(local_940,(long)&local_a24);
      if (local_968._0_8_ != local_968._8_8_) {
        pbVar34 = (pointer)local_968._0_8_;
        do {
          local_9e8 = (undefined1  [16])0x0;
          local_9f8 = (undefined1  [16])0x0;
          strncpy(local_9f8,(pbVar34->_M_dataplus)._M_p,0x1f);
          std::ostream::write(local_940,(long)local_9f8);
          pbVar34 = pbVar34 + 1;
        } while (pbVar34 != (pointer)local_968._8_8_);
      }
      std::ostream::write(local_940,(long)__s_00);
      std::ofstream::close();
      local_940 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_940 + *(long *)(_VTT + -0x18)) = _log;
      std::filebuf::~filebuf((filebuf *)&local_938);
      std::ios_base::~ios_base(local_848);
      operator_delete(__s_00);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_9a8);
      std::ifstream::~ifstream(local_740);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_538);
      std::ios_base::~ios_base(local_4c0);
      std::__cxx11::istringstream::~istringstream(local_3b8);
      std::ios_base::~ios_base(local_340);
      std::ifstream::~ifstream(local_238);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_968);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
      ::~_Rb_tree(&local_9d8);
      std::
      vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
      ::~vector((vector<MeCab::(anonymous_namespace)::Range,_std::allocator<MeCab::(anonymous_namespace)::Range>_>
                 *)local_a18);
      operator_delete__(puVar14);
      operator_delete__(__s);
      return true;
    }
    sVar15 = strlen(__s);
    if ((long)sVar15 < 1) {
LAB_00130f87:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"n >= 1",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"format error: ",0xe);
      sVar15 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,__s,sVar15);
      die::~die((die *)local_940);
    }
    else {
      pcVar25 = __s + sVar15;
      uVar28 = 2;
      pcVar17 = __s;
      puVar21 = puVar14;
      local_a20 = sVar15;
      do {
        for (; (cVar3 = *pcVar17, cVar3 == '\t' || (cVar3 == ' ')); pcVar17 = pcVar17 + 1) {
        }
        if (cVar3 == '\"') {
          pcVar17 = pcVar17 + 1;
          pcVar29 = pcVar17;
          for (pcVar22 = pcVar17;
              (pcVar27 = pcVar22, pcVar22 < pcVar25 &&
              ((*pcVar22 != '\"' ||
               (pcVar27 = pcVar22 + 1, pcVar1 = pcVar22 + 1, pcVar22 = pcVar27, *pcVar1 == '\"'))));
              pcVar22 = pcVar22 + 1) {
            *pcVar29 = *pcVar22;
            pcVar29 = pcVar29 + 1;
          }
          local_940[0] = 0x2c;
          pcVar22 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                              (pcVar27,pcVar25,(key_type *)local_940);
        }
        else {
          local_940[0] = 0x2c;
          pcVar22 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                              (pcVar17,pcVar25,(key_type *)local_940);
          pcVar29 = pcVar22;
        }
        if (1 < uVar28) {
          *pcVar29 = '\0';
        }
        *puVar21 = pcVar17;
        uVar28 = uVar28 - 1;
        if (uVar28 == 0) break;
        puVar21 = puVar21 + 1;
        pcVar17 = pcVar22 + 1;
      } while (pcVar17 < pcVar25);
      if ((long)local_a20 < 1) goto LAB_00130f87;
    }
    std::__cxx11::string::string((string *)local_940,(char *)*puVar14,(allocator *)local_9f8);
    iVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::CharInfo>_>_>
             ::find(&local_9d8,(key_type *)local_940);
    if ((_Rb_tree_header *)iVar19._M_node == &local_9d8._M_impl.super__Rb_tree_header) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"category.find(key) != category.end()",0x24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"category [",10);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,(char *)local_940,local_938);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"] is undefined in ",0x12);
      pcVar25 = local_948;
      if (local_948 == (char *)0x0) {
        std::ios::clear((int)poVar18 + (int)*(undefined8 *)(*(long *)poVar18 + -0x18));
      }
      else {
        sVar15 = strlen(local_948);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar25,sVar15);
      }
      die::~die((die *)local_9f8);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_9a8,(key_type *)local_940);
    if (local_940 != (undefined1  [8])&local_930) {
      operator_delete((void *)local_940);
    }
  } while( true );
}

Assistant:

bool CharProperty::compile(const char *cfile,
                           const char *ufile,
                           const char *ofile) {
  scoped_fixed_array<char, BUF_SIZE> line;
  scoped_fixed_array<char *, 512> col;
  size_t id = 0;
  std::vector<Range> range;
  std::map<std::string, CharInfo> category;
  std::vector<std::string> category_ary;
  std::ifstream ifs(WPATH(cfile));
  std::istringstream iss(CHAR_PROPERTY_DEF_DEFAULT);
  std::istream *is = &ifs;

  if (!ifs) {
    std::cerr << cfile
              << " is not found. minimum setting is used" << std::endl;
    is = &iss;
  }

  while (is->getline(line.get(), line.size())) {
    if (std::strlen(line.get()) == 0 || line[0] == '#') {
      continue;
    }
    const size_t size = tokenize2(line.get(), "\t ", col.get(), col.size());
    CHECK_DIE(size >= 2) << "format error: " << line.get();

    // 0xFFFF..0xFFFF hoge hoge hgoe #
    if (std::strncmp(col[0], "0x", 2) == 0) {
      std::string low = col[0];
      std::string high;
      size_t pos = low.find("..");

      if (pos != std::string::npos) {
        high = low.substr(pos + 2, low.size() - pos - 2);
        low  = low.substr(0, pos);
      } else {
        high = low;
      }

      Range r;
      r.low = atohex(low.c_str());
      r.high = atohex(high.c_str());

      CHECK_DIE(r.low >= 0 && r.low < 0xffff &&
                r.high >= 0 && r.high < 0xffff &&
                r.low <= r.high)
          << "range error: low=" << r.low << " high=" << r.high;

      for (size_t i = 1; i < size; ++i) {
        if (col[i][0] == '#') {
          break;  // skip comments
        }
        CHECK_DIE(category.find(std::string(col[i])) != category.end())
            << "category [" << col[i] << "] is undefined";
        r.c.push_back(col[i]);
      }
      range.push_back(r);
    } else {
      CHECK_DIE(size >= 4) << "format error: " << line.get();

      std::string key = col[0];
      CHECK_DIE(category.find(key) == category.end())
          << "category " << key << " is already defined";

      CharInfo c;
      std::memset(&c, 0, sizeof(c));
      c.invoke  = std::atoi(col[1]);
      c.group   = std::atoi(col[2]);
      c.length  = std::atoi(col[3]);
      c.default_type = id++;

      category.insert(std::pair<std::string, CharInfo>(key, c));
      category_ary.push_back(key);
    }
  }

  CHECK_DIE(category.size() < 18) << "too many categories(>= 18)";

  CHECK_DIE(category.find("DEFAULT") != category.end())
      << "category [DEFAULT] is undefined";

  CHECK_DIE(category.find("SPACE") != category.end())
      << "category [SPACE] is undefined";

  std::istringstream iss2(UNK_DEF_DEFAULT);
  std::ifstream ifs2(WPATH(ufile));
  std::istream *is2 = &ifs2;

  if (!ifs2) {
    std::cerr << ufile
              << " is not found. minimum setting is used." << std::endl;
    is2 = &iss2;
  }

  std::set<std::string> unk;
  while (is2->getline(line.get(), line.size())) {
    const size_t n = tokenizeCSV(line.get(), col.get(), 2);
    CHECK_DIE(n >= 1) << "format error: " << line.get();
    const std::string key = col[0];
    CHECK_DIE(category.find(key) != category.end())
        << "category [" << key << "] is undefined in " << cfile;
    unk.insert(key);
  }

  for (std::map<std::string, CharInfo>::const_iterator it = category.begin();
       it != category.end();
       ++it) {
    CHECK_DIE(unk.find(it->first) != unk.end())
        << "category [" << it->first << "] is undefined in " << ufile;
  }

  std::vector<CharInfo> table(0xffff);
  {
    std::vector<std::string> tmp;
    tmp.push_back("DEFAULT");
    const CharInfo c = encode(tmp, &category);
    std::fill(table.begin(), table.end(), c);
  }

  for (std::vector<Range>::const_iterator it = range.begin();
       it != range.end();
       ++it) {
    const CharInfo c = encode(it->c, &category);
    for (int i = it->low; i <= it->high; ++i) {
      table[i] = c;
    }
  }

  // output binary table
  {
    std::ofstream ofs(WPATH(ofile), std::ios::binary|std::ios::out);
    CHECK_DIE(ofs) << "permission denied: " << ofile;

    unsigned int size = static_cast<unsigned int>(category.size());
    ofs.write(reinterpret_cast<const char*>(&size), sizeof(size));
    for (std::vector<std::string>::const_iterator it = category_ary.begin();
         it != category_ary.end();
         ++it) {
      char buf[32];
      std::fill(buf, buf + sizeof(buf), '\0');
      std::strncpy(buf, it->c_str(), sizeof(buf) - 1);
      ofs.write(reinterpret_cast<const char*>(buf), sizeof(buf));
    }
    ofs.write(reinterpret_cast<const char*>(&table[0]),
              sizeof(CharInfo) * table.size());
    ofs.close();
  }

  return true;
}